

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_header.cc
# Opt level: O0

bool webrtc::ReadWavHeader
               (ReadableWav *readable,size_t *num_channels,int *sample_rate,WavFormat *format,
               size_t *bytes_per_sample,size_t *num_samples)

{
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  webrtc local_110 [32];
  webrtc local_f0 [32];
  webrtc local_d0 [48];
  webrtc local_a0 [32];
  ulong local_80;
  size_t bytes_in_payload;
  uint32_t local_70;
  uint32_t uStack_6c;
  int16_t ext_size;
  uint32_t fmt_size;
  WavHeader header;
  size_t *num_samples_local;
  size_t *bytes_per_sample_local;
  WavFormat *format_local;
  int *sample_rate_local;
  size_t *num_channels_local;
  ReadableWav *readable_local;
  
  header.data.header = (ChunkHeader)num_samples;
  iVar4 = (**readable->_vptr_ReadableWav)(readable,&stack0xffffffffffffff94,0x24);
  if (CONCAT44(extraout_var,iVar4) != 0x24) {
    return false;
  }
  local_70 = ReadLE32(header.riff.Format);
  if (local_70 != 0x10) {
    if (local_70 != 0x12) {
      return false;
    }
    iVar4 = (**readable->_vptr_ReadableWav)(readable,(long)&bytes_in_payload + 6,2);
    if (CONCAT44(extraout_var_00,iVar4) != 2) {
      return false;
    }
    if (bytes_in_payload._6_2_ != 0) {
      return false;
    }
  }
  iVar4 = (**readable->_vptr_ReadableWav)(readable,&header.fmt.ByteRate,8);
  if (CONCAT44(extraout_var_01,iVar4) == 8) {
    uVar2 = ReadLE16((uint16_t)header.fmt.header.ID);
    *format = (uint)uVar2;
    uVar2 = ReadLE16(header.fmt.header.ID._2_2_);
    *num_channels = (ulong)uVar2;
    uVar5 = ReadLE32(header.fmt.header.Size);
    *sample_rate = uVar5;
    uVar2 = ReadLE16(header.fmt.SampleRate._2_2_);
    *bytes_per_sample = (long)(int)(uVar2 / 8);
    uVar5 = ReadLE32(header.fmt._20_4_);
    local_80 = (ulong)uVar5;
    if (*bytes_per_sample == 0) {
      readable_local._7_1_ = false;
    }
    else {
      *(ulong *)header.data.header = local_80 / *bytes_per_sample;
      ReadFourCC_abi_cxx11_(local_a0,uStack_6c);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a0,"RIFF");
      std::__cxx11::string::~string((string *)local_a0);
      if (bVar1) {
        readable_local._7_1_ = false;
      }
      else {
        ReadFourCC_abi_cxx11_(local_d0,header.riff.header.ID);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_d0,"WAVE");
        std::__cxx11::string::~string((string *)local_d0);
        if (bVar1) {
          readable_local._7_1_ = false;
        }
        else {
          ReadFourCC_abi_cxx11_(local_f0,header.riff.header.Size);
          bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_f0,"fmt ");
          std::__cxx11::string::~string((string *)local_f0);
          if (bVar1) {
            readable_local._7_1_ = false;
          }
          else {
            ReadFourCC_abi_cxx11_(local_110,header.fmt.ByteRate);
            bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_110,"data");
            std::__cxx11::string::~string((string *)local_110);
            if (bVar1) {
              readable_local._7_1_ = false;
            }
            else {
              uVar5 = ReadLE32(fmt_size);
              uVar6 = RiffChunkSize(local_80);
              if (uVar5 < uVar6) {
                readable_local._7_1_ = false;
              }
              else {
                uVar5 = ReadLE32(header.fmt._8_4_);
                uVar6 = ByteRate(*num_channels,*sample_rate,*bytes_per_sample);
                if (uVar5 == uVar6) {
                  uVar2 = ReadLE16((uint16_t)header.fmt.SampleRate);
                  uVar3 = BlockAlign(*num_channels,*bytes_per_sample);
                  if (uVar2 == uVar3) {
                    readable_local._7_1_ =
                         CheckWavParameters(*num_channels,*sample_rate,*format,*bytes_per_sample,
                                            *(size_t *)header.data.header);
                  }
                  else {
                    readable_local._7_1_ = false;
                  }
                }
                else {
                  readable_local._7_1_ = false;
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    readable_local._7_1_ = false;
  }
  return readable_local._7_1_;
}

Assistant:

bool ReadWavHeader(ReadableWav* readable,
                   size_t* num_channels,
                   int* sample_rate,
                   WavFormat* format,
                   size_t* bytes_per_sample,
                   size_t* num_samples) {
  WavHeader header;
  if (readable->Read(&header, kWavHeaderSize - sizeof(header.data)) !=
      kWavHeaderSize - sizeof(header.data))
    return false;

  const uint32_t fmt_size = ReadLE32(header.fmt.header.Size);
  if (fmt_size != kFmtSubchunkSize) {
    // There is an optional two-byte extension field permitted to be present
    // with PCM, but which must be zero.
    int16_t ext_size;
    if (kFmtSubchunkSize + sizeof(ext_size) != fmt_size)
      return false;
    if (readable->Read(&ext_size, sizeof(ext_size)) != sizeof(ext_size))
      return false;
    if (ext_size != 0)
      return false;
  }
  if (readable->Read(&header.data, sizeof(header.data)) != sizeof(header.data))
    return false;

  // Parse needed fields.
  *format = static_cast<WavFormat>(ReadLE16(header.fmt.AudioFormat));
  *num_channels = ReadLE16(header.fmt.NumChannels);
  *sample_rate = ReadLE32(header.fmt.SampleRate);
  *bytes_per_sample = ReadLE16(header.fmt.BitsPerSample) / 8;
  const size_t bytes_in_payload = ReadLE32(header.data.header.Size);
  if (*bytes_per_sample == 0)
    return false;
  *num_samples = bytes_in_payload / *bytes_per_sample;

  // Sanity check remaining fields.
  if (ReadFourCC(header.riff.header.ID) != "RIFF")
    return false;
  if (ReadFourCC(header.riff.Format) != "WAVE")
    return false;
  if (ReadFourCC(header.fmt.header.ID) != "fmt ")
    return false;
  if (ReadFourCC(header.data.header.ID) != "data")
    return false;

  if (ReadLE32(header.riff.header.Size) < RiffChunkSize(bytes_in_payload))
    return false;
  if (ReadLE32(header.fmt.ByteRate) !=
      ByteRate(*num_channels, *sample_rate, *bytes_per_sample))
    return false;
  if (ReadLE16(header.fmt.BlockAlign) !=
      BlockAlign(*num_channels, *bytes_per_sample))
    return false;

  return CheckWavParameters(*num_channels, *sample_rate, *format,
                            *bytes_per_sample, *num_samples);
}